

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

MatchMatrix * __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<phmap::flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>const&>
::
AnalyzeElements<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::const_iterator>
          (MatchMatrix *__return_storage_ptr__,
          UnorderedElementsAreMatcherImpl<phmap::flat_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>const&>
          *this,const_iterator elem_first,const_iterator elem_last,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *element_printouts,MatchResultListener *listener)

{
  char cVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [11];
  undefined1 auVar10 [12];
  undefined1 auVar11 [13];
  undefined1 auVar12 [14];
  MatchMatrix *pMVar13;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  pair<const_int,_phmap::priv::NonStandardLayout> *extraout_RDX;
  pair<const_int,_phmap::priv::NonStandardLayout> *extraout_RDX_00;
  pair<const_int,_phmap::priv::NonStandardLayout> *extraout_RDX_01;
  pair<const_int,_phmap::priv::NonStandardLayout> *extraout_RDX_02;
  pair<const_int,_phmap::priv::NonStandardLayout> *value;
  size_t sVar17;
  long lVar18;
  pointer pcVar19;
  char *pcVar20;
  anon_union_8_1_a8a14541_for_iterator_1 x;
  long lVar21;
  size_t sVar22;
  long lVar23;
  bool bVar24;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  MatchMatrix *matrix;
  DummyMatchResultListener dummy;
  allocator_type local_91;
  size_t local_90;
  undefined1 local_88 [16];
  pointer local_78;
  string local_70;
  MatchMatrix *local_50;
  char *local_48;
  MatchResultListener local_40;
  
  pcVar20 = elem_last.inner_.ctrl_;
  x = elem_first.inner_.field_1;
  pcVar16 = elem_first.inner_.ctrl_;
  local_50 = __return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(element_printouts,
                    (element_printouts->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  local_78 = (pointer)0x0;
  local_88 = (undefined1  [16])0x0;
  local_40.stream_ = (ostream *)0x0;
  local_40._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_00322228;
  local_48 = pcVar20;
  if (pcVar16 == pcVar20) {
    lVar18 = *(long *)(this + 0x28);
    lVar15 = *(long *)(this + 0x30);
    sVar22 = 0;
  }
  else {
    sVar22 = 0;
    value = extraout_RDX;
    do {
      if (listener->stream_ != (ostream *)0x0) {
        PrintToString<std::pair<int_const,phmap::priv::NonStandardLayout>>
                  (&local_70,(testing *)x.slot_,value);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   element_printouts,&local_70);
        value = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
            &local_70.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_),
                          local_70.field_2._M_allocated_capacity + 1);
          value = extraout_RDX_01;
        }
      }
      lVar15 = *(long *)(this + 0x30);
      lVar18 = lVar15;
      local_90 = sVar22;
      if (lVar15 != *(long *)(this + 0x28)) {
        lVar21 = 0;
        lVar23 = 0;
        lVar18 = *(long *)(this + 0x28);
        do {
          local_70._M_dataplus._M_p._0_1_ =
               MatcherBase<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>::
               MatchAndExplain((MatcherBase<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>
                                *)(lVar18 + lVar21),
                               (pair<const_int,_phmap::priv::NonStandardLayout> *)x.slot_,&local_40)
          ;
          std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    ((vector<char,_std::allocator<char>_> *)local_88,(char *)&local_70);
          lVar23 = lVar23 + 1;
          lVar18 = *(long *)(this + 0x28);
          lVar15 = *(long *)(this + 0x30);
          lVar21 = lVar21 + 0x18;
          value = extraout_RDX_02;
        } while (lVar23 != (lVar15 - lVar18 >> 3) * -0x5555555555555555);
      }
      x.slot_ = x.slot_ + 1;
      cVar1 = pcVar16[1];
      pcVar16 = pcVar16 + 1;
      while (cVar1 < -1) {
        iVar5 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                       CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
        iVar6 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                       CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
        iVar7 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                       CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
        iVar8 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                       CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
        in_XMM1_Ba = -(*pcVar16 < (char)iVar5);
        in_XMM1_Bb = -(pcVar16[1] < (char)((uint)iVar5 >> 8));
        in_XMM1_Bc = -(pcVar16[2] < (char)((uint)iVar5 >> 0x10));
        in_XMM1_Bd = -(pcVar16[3] < (char)((uint)iVar5 >> 0x18));
        in_XMM1_Be = -(pcVar16[4] < (char)iVar6);
        in_XMM1_Bf = -(pcVar16[5] < (char)((uint)iVar6 >> 8));
        in_XMM1_Bg = -(pcVar16[6] < (char)((uint)iVar6 >> 0x10));
        in_XMM1_Bh = -(pcVar16[7] < (char)((uint)iVar6 >> 0x18));
        in_XMM1_Bi = -(pcVar16[8] < (char)iVar7);
        in_XMM1_Bj = -(pcVar16[9] < (char)((uint)iVar7 >> 8));
        in_XMM1_Bk = -(pcVar16[10] < (char)((uint)iVar7 >> 0x10));
        in_XMM1_Bl = -(pcVar16[0xb] < (char)((uint)iVar7 >> 0x18));
        in_XMM1_Bm = -(pcVar16[0xc] < (char)iVar8);
        in_XMM1_Bn = -(pcVar16[0xd] < (char)((uint)iVar8 >> 8));
        in_XMM1_Bo = -(pcVar16[0xe] < (char)((uint)iVar8 >> 0x10));
        in_XMM1_Bp = -(pcVar16[0xf] < (char)((uint)iVar8 >> 0x18));
        auVar3[1] = in_XMM1_Bb;
        auVar3[0] = in_XMM1_Ba;
        auVar3[2] = in_XMM1_Bc;
        auVar3[3] = in_XMM1_Bd;
        auVar3[4] = in_XMM1_Be;
        auVar3[5] = in_XMM1_Bf;
        auVar3[6] = in_XMM1_Bg;
        auVar3[7] = in_XMM1_Bh;
        auVar3[8] = in_XMM1_Bi;
        auVar3[9] = in_XMM1_Bj;
        auVar3[10] = in_XMM1_Bk;
        auVar3[0xb] = in_XMM1_Bl;
        auVar3[0xc] = in_XMM1_Bm;
        auVar3[0xd] = in_XMM1_Bn;
        auVar3[0xe] = in_XMM1_Bo;
        auVar3[0xf] = in_XMM1_Bp;
        auVar4[1] = in_XMM1_Bb;
        auVar4[0] = in_XMM1_Ba;
        auVar4[2] = in_XMM1_Bc;
        auVar4[3] = in_XMM1_Bd;
        auVar4[4] = in_XMM1_Be;
        auVar4[5] = in_XMM1_Bf;
        auVar4[6] = in_XMM1_Bg;
        auVar4[7] = in_XMM1_Bh;
        auVar4[8] = in_XMM1_Bi;
        auVar4[9] = in_XMM1_Bj;
        auVar4[10] = in_XMM1_Bk;
        auVar4[0xb] = in_XMM1_Bl;
        auVar4[0xc] = in_XMM1_Bm;
        auVar4[0xd] = in_XMM1_Bn;
        auVar4[0xe] = in_XMM1_Bo;
        auVar4[0xf] = in_XMM1_Bp;
        auVar12[1] = in_XMM1_Bd;
        auVar12[0] = in_XMM1_Bc;
        auVar12[2] = in_XMM1_Be;
        auVar12[3] = in_XMM1_Bf;
        auVar12[4] = in_XMM1_Bg;
        auVar12[5] = in_XMM1_Bh;
        auVar12[6] = in_XMM1_Bi;
        auVar12[7] = in_XMM1_Bj;
        auVar12[8] = in_XMM1_Bk;
        auVar12[9] = in_XMM1_Bl;
        auVar12[10] = in_XMM1_Bm;
        auVar12[0xb] = in_XMM1_Bn;
        auVar12[0xc] = in_XMM1_Bo;
        auVar12[0xd] = in_XMM1_Bp;
        auVar11[1] = in_XMM1_Be;
        auVar11[0] = in_XMM1_Bd;
        auVar11[2] = in_XMM1_Bf;
        auVar11[3] = in_XMM1_Bg;
        auVar11[4] = in_XMM1_Bh;
        auVar11[5] = in_XMM1_Bi;
        auVar11[6] = in_XMM1_Bj;
        auVar11[7] = in_XMM1_Bk;
        auVar11[8] = in_XMM1_Bl;
        auVar11[9] = in_XMM1_Bm;
        auVar11[10] = in_XMM1_Bn;
        auVar11[0xb] = in_XMM1_Bo;
        auVar11[0xc] = in_XMM1_Bp;
        auVar10[1] = in_XMM1_Bf;
        auVar10[0] = in_XMM1_Be;
        auVar10[2] = in_XMM1_Bg;
        auVar10[3] = in_XMM1_Bh;
        auVar10[4] = in_XMM1_Bi;
        auVar10[5] = in_XMM1_Bj;
        auVar10[6] = in_XMM1_Bk;
        auVar10[7] = in_XMM1_Bl;
        auVar10[8] = in_XMM1_Bm;
        auVar10[9] = in_XMM1_Bn;
        auVar10[10] = in_XMM1_Bo;
        auVar10[0xb] = in_XMM1_Bp;
        auVar9[1] = in_XMM1_Bg;
        auVar9[0] = in_XMM1_Bf;
        auVar9[2] = in_XMM1_Bh;
        auVar9[3] = in_XMM1_Bi;
        auVar9[4] = in_XMM1_Bj;
        auVar9[5] = in_XMM1_Bk;
        auVar9[6] = in_XMM1_Bl;
        auVar9[7] = in_XMM1_Bm;
        auVar9[8] = in_XMM1_Bn;
        auVar9[9] = in_XMM1_Bo;
        auVar9[10] = in_XMM1_Bp;
        uVar14 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar12 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar11 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar9 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar2 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        value = (pair<const_int,_phmap::priv::NonStandardLayout> *)(ulong)(uVar2 * 0x30);
        x.slot_ = (slot_type *)((long)x.slot_ + (long)value);
        cVar1 = pcVar16[uVar2];
        pcVar16 = pcVar16 + uVar2;
      }
      sVar22 = local_90 + 1;
    } while (pcVar16 != local_48);
  }
  pMVar13 = local_50;
  sVar17 = (lVar15 - lVar18 >> 3) * -0x5555555555555555;
  local_50->num_elements_ = sVar22;
  local_50->num_matchers_ = sVar17;
  local_70._M_dataplus._M_p._0_1_ = 0;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_50->matched_,sVar17 * sVar22,(value_type *)&local_70,&local_91);
  if (sVar22 != 0) {
    lVar15 = *(long *)(this + 0x28);
    lVar18 = *(long *)(this + 0x30);
    sVar17 = 0;
    pcVar19 = (pointer)local_88._0_8_;
    do {
      bVar24 = lVar18 != lVar15;
      lVar18 = lVar15;
      if (bVar24) {
        lVar18 = 0;
        do {
          (pMVar13->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar18 + pMVar13->num_matchers_ * sVar17] =
               pcVar19[lVar18] != '\0';
          lVar18 = lVar18 + 1;
          lVar15 = *(long *)(this + 0x28);
        } while (lVar18 != (*(long *)(this + 0x30) - lVar15 >> 3) * -0x5555555555555555);
        pcVar19 = pcVar19 + lVar18;
        lVar18 = *(long *)(this + 0x30);
      }
      sVar17 = sVar17 + 1;
    } while (sVar17 != sVar22);
  }
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
  }
  return pMVar13;
}

Assistant:

MatchMatrix AnalyzeElements(ElementIter elem_first, ElementIter elem_last,
                              ::std::vector<std::string>* element_printouts,
                              MatchResultListener* listener) const {
    element_printouts->clear();
    ::std::vector<char> did_match;
    size_t num_elements = 0;
    DummyMatchResultListener dummy;
    for (; elem_first != elem_last; ++num_elements, ++elem_first) {
      if (listener->IsInterested()) {
        element_printouts->push_back(PrintToString(*elem_first));
      }
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        did_match.push_back(
            matchers_[irhs].MatchAndExplain(*elem_first, &dummy));
      }
    }

    MatchMatrix matrix(num_elements, matchers_.size());
    ::std::vector<char>::const_iterator did_match_iter = did_match.begin();
    for (size_t ilhs = 0; ilhs != num_elements; ++ilhs) {
      for (size_t irhs = 0; irhs != matchers_.size(); ++irhs) {
        matrix.SetEdge(ilhs, irhs, *did_match_iter++ != 0);
      }
    }
    return matrix;
  }